

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

utf8_size_t utf8_wrap_length(utf8_char_t *data,utf8_size_t size)

{
  byte bVar1;
  utf8_size_t uVar2;
  utf8_size_t uVar3;
  size_t split_at;
  utf8_size_t uVar4;
  long lVar5;
  
  uVar3 = 0;
  uVar4 = size;
  do {
    bVar1 = *data;
    if (bVar1 == 10) {
      return uVar3;
    }
    if (bVar1 == 0xd) {
      return uVar3;
    }
    uVar2 = uVar3;
    if (0x20 < bVar1) {
      if (bVar1 == 0xc2) {
        if (((byte *)data)[1] != 0xa0) goto LAB_00101541;
      }
      else if (bVar1 != 0x7f) {
LAB_00101541:
        uVar2 = uVar4;
      }
    }
    if (bVar1 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar1 & 0xfffffff8));
    }
    data = (utf8_char_t *)((byte *)data + lVar5);
    uVar3 = uVar3 + 1;
    uVar4 = uVar2;
    if (size < uVar3) {
      return uVar2;
    }
  } while( true );
}

Assistant:

utf8_size_t utf8_wrap_length(const utf8_char_t* data, utf8_size_t size)
{
    // Set split_at to size, so if a split point cna not be found, retuns the size passed in
    size_t char_length, char_count, split_at = size;

    for (char_count = 0; char_count <= size; ++char_count) {
        if (_utf8_newline(data)) {
            return char_count;
        } else if (utf8_char_whitespace(data)) {
            split_at = char_count;
        }

        char_length = utf8_char_length(data);
        data += char_length;
    }

    return split_at;
}